

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

ItemBlock * __thiscall
VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::CreateNewBlock
          (VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *this)

{
  size_t sVar1;
  ItemBlock *pIVar2;
  undefined1 auVar3 [16];
  Item *pIVar4;
  ulong uVar5;
  ulong uVar6;
  Item *pIVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  
  sVar1 = (this->m_ItemBlocks).m_Count;
  if (sVar1 == 0) {
    uVar8 = this->m_FirstBlockCapacity;
  }
  else {
    uVar8 = (this->m_ItemBlocks).m_pArray[sVar1 - 1].Capacity * 3 >> 1;
  }
  pIVar4 = (Item *)VmaMalloc(this->m_pAllocationCallbacks,(ulong)uVar8 * 0x30,8);
  sVar1 = (this->m_ItemBlocks).m_Count;
  VmaVector<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::ItemBlock>_>
  ::resize(&this->m_ItemBlocks,sVar1 + 1);
  pIVar2 = (this->m_ItemBlocks).m_pArray;
  pIVar2[sVar1].pItems = pIVar4;
  pIVar2[sVar1].Capacity = uVar8;
  pIVar2[sVar1].FirstFreeIndex = 0;
  auVar3 = _DAT_00232730;
  uVar5 = (ulong)(uVar8 - 1);
  if (uVar8 - 1 != 0) {
    uVar6 = uVar5 + 1 & 0xfffffffffffffffe;
    lVar12 = uVar5 - 1;
    auVar9._8_4_ = (int)lVar12;
    auVar9._0_8_ = lVar12;
    auVar9._12_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar9 = auVar9 ^ _DAT_00232730;
    pIVar7 = pIVar4;
    auVar10 = _DAT_00232810;
    do {
      auVar11 = auVar10 ^ auVar3;
      lVar12 = auVar10._8_8_;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        pIVar7->NextFreeIndex = (uint32_t)(auVar10._0_8_ + 1);
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        (&pIVar7->NextFreeIndex)[0xc] = (uint32_t)(lVar12 + 1);
      }
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar12 + 2;
      pIVar7 = (Item *)(&pIVar7->NextFreeIndex + 0x18);
      uVar6 = uVar6 - 2;
    } while (uVar6 != 0);
  }
  (&pIVar4->NextFreeIndex)[uVar5 * 0xc] = 0xffffffff;
  return (this->m_ItemBlocks).m_pArray + ((this->m_ItemBlocks).m_Count - 1);
}

Assistant:

typename VmaPoolAllocator<T>::ItemBlock& VmaPoolAllocator<T>::CreateNewBlock()
{
    const uint32_t newBlockCapacity = m_ItemBlocks.empty() ?
        m_FirstBlockCapacity : m_ItemBlocks.back().Capacity * 3 / 2;

    const ItemBlock newBlock =
    {
        vma_new_array(m_pAllocationCallbacks, Item, newBlockCapacity),
        newBlockCapacity,
        0
    };

    m_ItemBlocks.push_back(newBlock);

    // Setup singly-linked list of all free items in this block.
    for (uint32_t i = 0; i < newBlockCapacity - 1; ++i)
        newBlock.pItems[i].NextFreeIndex = i + 1;
    newBlock.pItems[newBlockCapacity - 1].NextFreeIndex = UINT32_MAX;
    return m_ItemBlocks.back();
}